

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

void lj_record_stop(jit_State *J,TraceLink linktype,TraceNo lnk)

{
  TraceNo lnk_local;
  TraceLink linktype_local;
  jit_State *J_local;
  
  J->state = LJ_TRACE_END;
  (J->cur).linktype = (uint8_t)linktype;
  (J->cur).link = (TraceNo1)lnk;
  if ((lnk == (J->cur).traceno) && (J->framedepth + J->retdepth == 0)) {
    if ((J->flags & 0x400000) != 0) goto LAB_0019134e;
    if ((J->cur).root != 0) {
      (J->cur).link = (J->cur).root;
    }
  }
  canonicalize_slots(J);
LAB_0019134e:
  lj_snap_add(J);
  J->needsnap = '\0';
  J->mergesnap = '\x01';
  return;
}

Assistant:

void lj_record_stop(jit_State *J, TraceLink linktype, TraceNo lnk)
{
#ifdef LUAJIT_ENABLE_TABLE_BUMP
  if (J->retryrec)
    lj_trace_err(J, LJ_TRERR_RETRY);
#endif
  lj_trace_end(J);
  J->cur.linktype = (uint8_t)linktype;
  J->cur.link = (uint16_t)lnk;
  /* Looping back at the same stack level? */
  if (lnk == J->cur.traceno && J->framedepth + J->retdepth == 0) {
    if ((J->flags & JIT_F_OPT_LOOP))  /* Shall we try to create a loop? */
      goto nocanon;  /* Do not canonicalize or we lose the narrowing. */
    if (J->cur.root)  /* Otherwise ensure we always link to the root trace. */
      J->cur.link = J->cur.root;
  }
  canonicalize_slots(J);
nocanon:
  /* Note: all loop ops must set J->pc to the following instruction! */
  lj_snap_add(J);  /* Add loop snapshot. */
  J->needsnap = 0;
  J->mergesnap = 1;  /* In case recording continues. */
}